

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int cmp_init_el(void *p1,void *p2)

{
  long lVar1;
  type *ptVar2;
  mir_size_t mVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  lVar1 = *(long *)((long)p1 + 0x18);
  if ((lVar1 == 0) || ((int)*(uint *)(lVar1 + 4) < 0)) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(*(uint *)(lVar1 + 4) >> 3);
  }
  lVar4 = *(long *)((long)p2 + 0x18);
  if ((lVar4 == 0) || ((int)*(uint *)(lVar4 + 4) < 0)) {
    uVar7 = 0;
  }
  else {
    uVar7 = (ulong)(*(uint *)(lVar4 + 4) >> 3);
  }
  uVar5 = uVar5 + *(long *)((long)p1 + 0x10);
  uVar7 = uVar7 + *(long *)((long)p2 + 0x10);
  if (uVar5 < uVar7) {
LAB_001a80fe:
    uVar6 = 0xffffffff;
  }
  else {
    if (uVar7 < uVar5) {
      return 1;
    }
    if (lVar1 != 0) {
      if (lVar4 != 0) {
        if (*(int *)(lVar1 + 4) < *(int *)(lVar4 + 4)) goto LAB_001a80fe;
        if (*(int *)(lVar4 + 4) < *(int *)(lVar1 + 4)) {
          return 1;
        }
      }
      ptVar2 = *(type **)(lVar1 + 0x40);
      mVar3 = raw_type_size(*p1,ptVar2);
      uVar5 = (ulong)ptVar2->align;
      if (uVar5 != 0) {
        uVar7 = (mVar3 - 1) + uVar5;
        mVar3 = uVar7 - uVar7 % uVar5;
      }
      if (mVar3 == 0) goto LAB_001a80fe;
      lVar4 = *(long *)((long)p2 + 0x18);
    }
    if (lVar4 != 0) {
      ptVar2 = *(type **)(lVar4 + 0x40);
      mVar3 = raw_type_size(*p2,ptVar2);
      uVar5 = (ulong)ptVar2->align;
      if (uVar5 != 0) {
        uVar7 = (mVar3 - 1) + uVar5;
        mVar3 = uVar7 - uVar7 % uVar5;
      }
      if (mVar3 == 0) {
        return 1;
      }
    }
    uVar6 = 0xffffffff;
    if (*(ulong *)((long)p2 + 8) <= *(ulong *)((long)p1 + 8)) {
      uVar6 = (uint)(*(ulong *)((long)p2 + 8) < *(ulong *)((long)p1 + 8));
    }
  }
  return uVar6;
}

Assistant:

static int cmp_init_el (const void *p1, const void *p2) {
  const init_el_t *el1 = p1, *el2 = p2;
  int bit_offset1 = el1->member_decl == NULL || el1->member_decl->bit_offset < 0
                      ? 0
                      : el1->member_decl->bit_offset;
  int bit_offset2 = el2->member_decl == NULL || el2->member_decl->bit_offset < 0
                      ? 0
                      : el2->member_decl->bit_offset;

  if (el1->offset + bit_offset1 / MIR_CHAR_BIT < el2->offset + bit_offset2 / MIR_CHAR_BIT)
    return -1;
  else if (el1->offset + bit_offset1 / MIR_CHAR_BIT > el2->offset + bit_offset2 / MIR_CHAR_BIT)
    return 1;
  else if (el1->member_decl != NULL && el2->member_decl != NULL
           && el1->member_decl->bit_offset < el2->member_decl->bit_offset)
    return -1;
  else if (el1->member_decl != NULL && el2->member_decl != NULL
           && el1->member_decl->bit_offset > el2->member_decl->bit_offset)
    return 1;
  else if (el1->member_decl != NULL
           && type_size (el1->c2m_ctx, el1->member_decl->decl_spec.type) == 0)
    return -1;
  else if (el2->member_decl != NULL
           && type_size (el2->c2m_ctx, el2->member_decl->decl_spec.type) == 0)
    return 1;
  else if (el1->num < el2->num)
    return -1;
  else if (el1->num > el2->num)
    return 1;
  else
    return 0;
}